

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall mjs::string::string(string *this,gc_heap *h,string_view *s)

{
  gc_heap_ptr<mjs::gc_string> local_30;
  string_view *local_20;
  string_view *s_local;
  gc_heap *h_local;
  string *this_local;
  
  local_20 = s;
  s_local = (string_view *)h;
  h_local = (gc_heap *)this;
  gc_string::make<char>((gc_string *)&local_30,h,s);
  gc_heap_ptr<mjs::gc_string>::gc_heap_ptr(&this->super_gc_heap_ptr<mjs::gc_string>,&local_30);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_30);
  return;
}

Assistant:

explicit string(gc_heap& h, const std::string_view& s) : gc_heap_ptr<gc_string>(gc_string::make(h, s)) {}